

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaBaseRunner.cpp
# Opt level: O0

bool __thiscall xmrig::CudaBaseRunner::set(CudaBaseRunner *this,Job *job,uint8_t *blob)

{
  bool bVar1;
  uint64_t uVar2;
  void *data;
  size_t in_RDX;
  Job *in_RSI;
  CudaBaseRunner *in_RDI;
  nvid_ctx *extra_iters;
  
  uVar2 = Job::height(in_RSI);
  in_RDI->m_height = uVar2;
  uVar2 = Job::target(in_RSI);
  in_RDI->m_target = uVar2;
  extra_iters = in_RDI->m_ctx;
  data = (void *)Job::size(in_RSI);
  Job::extraIters(in_RSI);
  CudaLib::setJob((nvid_ctx *)in_RDI,data,in_RDX,(uint64_t)extra_iters);
  bVar1 = callWrapper(in_RDI,SUB81((ulong)data >> 0x38,0));
  return bVar1;
}

Assistant:

bool xmrig::CudaBaseRunner::set(const Job &job, uint8_t *blob)
{
    m_height = job.height();
    m_target = job.target();

    return callWrapper(CudaLib::setJob(m_ctx, blob, job.size(), job.extraIters()));
}